

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O1

void ASDCP::ATMOS::AtmosDescriptorDump(AtmosDescriptor *ADesc,FILE *stream)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  undefined8 uVar8;
  undefined8 local_bf;
  undefined8 uStack_b7;
  UL local_a8;
  char atmosID_buf [40];
  char str_buf [40];
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  uVar4 = (ADesc->super_DCDataDescriptor).EditRate.Numerator;
  uVar5 = (ADesc->super_DCDataDescriptor).EditRate.Denominator;
  uVar6 = (ADesc->super_DCDataDescriptor).ContainerDuration;
  local_a8.super_Identifier<16U>.m_HasValue = true;
  local_a8.super_Identifier<16U>.m_Value._0_8_ =
       *(undefined8 *)(ADesc->super_DCDataDescriptor).DataEssenceCoding;
  local_a8.super_Identifier<16U>.m_Value._8_8_ =
       *(undefined8 *)((ADesc->super_DCDataDescriptor).DataEssenceCoding + 8);
  local_a8.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021f038;
  pcVar7 = UL::EncodeString(&local_a8,str_buf,0x28);
  bVar1 = ADesc->AtmosVersion;
  uVar2 = ADesc->MaxChannelCount;
  uVar3 = ADesc->MaxObjectCount;
  local_bf = *(undefined8 *)ADesc->AtmosID;
  uStack_b7 = *(undefined8 *)(ADesc->AtmosID + 8);
  uVar8 = Kumu::bin2UUIDhex((uchar *)&local_bf,0x10,atmosID_buf,0x28);
  fprintf((FILE *)stream,
          "          EditRate: %d/%d\n   ContainerDuration: %u\n   DataEssenceCoding: %s\n        AtmosVersion: %u\n     MaxChannelCount: %u\n      MaxObjectCount: %u\n             AtmosID: %s\n           FirsFrame: %u\n"
          ,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,pcVar7,(ulong)bVar1,(ulong)uVar2,(ulong)uVar3,
          uVar8,(ulong)ADesc->FirstFrame);
  return;
}

Assistant:

void
ASDCP::ATMOS::AtmosDescriptorDump(const AtmosDescriptor& ADesc, FILE* stream)
{
  char str_buf[40];
  char atmosID_buf[40];
  if ( stream == 0 )
    stream = stderr;

  fprintf(stream, "\
          EditRate: %d/%d\n\
   ContainerDuration: %u\n\
   DataEssenceCoding: %s\n\
        AtmosVersion: %u\n\
     MaxChannelCount: %u\n\
      MaxObjectCount: %u\n\
             AtmosID: %s\n\
           FirsFrame: %u\n",
          ADesc.EditRate.Numerator, ADesc.EditRate.Denominator,
          ADesc.ContainerDuration,
          UL(ADesc.DataEssenceCoding).EncodeString(str_buf, 40),
          ADesc.AtmosVersion,
          ADesc.MaxChannelCount,
          ADesc.MaxObjectCount,
          UUID(ADesc.AtmosID).EncodeString(atmosID_buf, 40),
          ADesc.FirstFrame);
}